

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlDocPtr xmlCopyDoc(xmlDocPtr doc,int recursive)

{
  int iVar1;
  _xmlNode *p_Var2;
  xmlDocPtr doc_00;
  char *pcVar3;
  xmlChar *pxVar4;
  xmlDtdPtr tree;
  xmlNsPtr pxVar5;
  _xmlNode *p_Var6;
  
  if (doc == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00 = xmlNewDoc(doc->version);
  if (doc_00 == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00->type = doc->type;
  if (doc->name != (char *)0x0) {
    pcVar3 = (*xmlMemStrdup)(doc->name);
    doc_00->name = pcVar3;
    if (pcVar3 == (char *)0x0) goto LAB_0014c077;
  }
  if (doc->encoding != (xmlChar *)0x0) {
    pxVar4 = xmlStrdup(doc->encoding);
    doc_00->encoding = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0014c077;
  }
  if (doc->URL != (xmlChar *)0x0) {
    pxVar4 = xmlStrdup(doc->URL);
    doc_00->URL = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0014c077;
  }
  doc_00->charset = doc->charset;
  iVar1 = doc->standalone;
  doc_00->compression = doc->compression;
  doc_00->standalone = iVar1;
  if (recursive == 0) {
    return doc_00;
  }
  doc_00->children = (_xmlNode *)0x0;
  doc_00->last = (_xmlNode *)0x0;
  if (doc->intSubset != (xmlDtdPtr)0x0) {
    tree = xmlCopyDtd(doc->intSubset);
    doc_00->intSubset = tree;
    if (tree == (xmlDtdPtr)0x0) goto LAB_0014c077;
    xmlSetTreeDoc((xmlNodePtr)tree,doc_00);
  }
  if (doc->oldNs != (xmlNsPtr)0x0) {
    pxVar5 = xmlCopyNamespaceList(doc->oldNs);
    doc_00->oldNs = pxVar5;
    if (pxVar5 == (xmlNsPtr)0x0) goto LAB_0014c077;
  }
  if (doc->children == (xmlNodePtr)0x0) {
    return doc_00;
  }
  p_Var6 = xmlStaticCopyNodeList(doc->children,doc_00,(xmlNodePtr)doc_00);
  doc_00->children = p_Var6;
  if (p_Var6 != (xmlNodePtr)0x0) {
    doc_00->last = (_xmlNode *)0x0;
    do {
      p_Var2 = p_Var6->next;
      if (p_Var6->next == (_xmlNode *)0x0) {
        doc_00->last = p_Var6;
        p_Var2 = p_Var6->next;
      }
      p_Var6 = p_Var2;
    } while (p_Var6 != (_xmlNode *)0x0);
    return doc_00;
  }
LAB_0014c077:
  xmlFreeDoc(doc_00);
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCopyDoc(xmlDocPtr doc, int recursive) {
    xmlDocPtr ret;

    if (doc == NULL) return(NULL);
    ret = xmlNewDoc(doc->version);
    if (ret == NULL) return(NULL);
    ret->type = doc->type;
    if (doc->name != NULL) {
        ret->name = xmlMemStrdup(doc->name);
        if (ret->name == NULL)
            goto error;
    }
    if (doc->encoding != NULL) {
        ret->encoding = xmlStrdup(doc->encoding);
        if (ret->encoding == NULL)
            goto error;
    }
    if (doc->URL != NULL) {
        ret->URL = xmlStrdup(doc->URL);
        if (ret->URL == NULL)
            goto error;
    }
    ret->charset = doc->charset;
    ret->compression = doc->compression;
    ret->standalone = doc->standalone;
    if (!recursive) return(ret);

    ret->last = NULL;
    ret->children = NULL;
    if (doc->intSubset != NULL) {
        ret->intSubset = xmlCopyDtd(doc->intSubset);
	if (ret->intSubset == NULL)
            goto error;
        /* Can't fail on DTD */
	xmlSetTreeDoc((xmlNodePtr)ret->intSubset, ret);
    }
    if (doc->oldNs != NULL) {
        ret->oldNs = xmlCopyNamespaceList(doc->oldNs);
        if (ret->oldNs == NULL)
            goto error;
    }
    if (doc->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(doc->children, ret,
		                               (xmlNodePtr)ret);
        if (ret->children == NULL)
            goto error;
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    return(ret);

error:
    xmlFreeDoc(ret);
    return(NULL);
}